

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_with_internal_transitions.cpp
# Opt level: O3

void __thiscall afsm::test::FSM_MachineWithInstate_Test::TestBody(FSM_MachineWithInstate_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  internal iVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  test_sm tsm;
  AssertHelper local_190;
  AssertHelper local_188;
  Message local_180;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  string local_170;
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  local_150;
  
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&local_150);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[5]>
            (&local_150.super_observer_wrapper<afsm::test::test_fsm_observer>,(char (*) [5])0x3f05c0
            );
  iVar3 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ss_.ptr_._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x42,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ =
       CONCAT31(local_180.ss_.ptr_._1_3_,
                local_150.
                super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                .super_type.
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
                .
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
                .transitions_.current_state_ != 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x43,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ = 2;
  local_190.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar3 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ss_.ptr_._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x48,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ =
       CONCAT31(local_180.ss_.ptr_._1_3_,
                local_150.
                super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                .super_type.
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
                .
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
                .transitions_.current_state_ != 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x49,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ = 3;
  local_190.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::a_to_b>(&local_150,(a_to_b *)&local_188);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process",
             "tsm.process_event(events::a_to_b{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar3 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ss_.ptr_._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x4f,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ =
       CONCAT31(local_180.ss_.ptr_._1_3_,
                local_150.
                super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                .super_type.
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
                .
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
                .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x50,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ = 2;
  local_190.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar3 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ss_.ptr_._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x55,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ =
       CONCAT31(local_180.ss_.ptr_._1_3_,
                local_150.
                super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                .super_type.
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
                .
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
                .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x56,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ = 3;
  local_190.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::b_to_a>(&local_150,(b_to_a *)&local_188);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process",
             "tsm.process_event(events::b_to_a{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar3 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ss_.ptr_._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5c,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ =
       CONCAT31(local_180.ss_.ptr_._1_3_,
                local_150.
                super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                .super_type.
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
                .
                super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
                .transitions_.current_state_ != 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5d,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190.data_._4_4_,(event_process_result)local_190.data_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ss_.ptr_._0_4_ = 2;
  local_190.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_180.ss_.ptr_._4_4_,local_180.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.deferred_event_ids_._M_t);
  std::__cxx11::
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_M_clear(&local_150.deferred_events_.
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            );
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::~deque(&local_150.queued_events_);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.deferred_._M_t);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.handled_._M_t);
  if (local_150.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
      super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(FSM, MachineWithInstate)
{
    test_sm tsm;
    tsm.make_observer("test");
    // *** INITIAL STATE ***
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // *** A -> B ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::a_to_b{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // *** B -> A ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::b_to_a{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
}